

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1ha0_ia32aes_a.h
# Opt level: O1

uint64_t t1ha0_ia32aes_noavx(void *data,size_t len,uint64_t seed)

{
  undefined1 (*pauVar1) [16];
  sbyte sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 *puVar8;
  undefined1 (*pauVar9) [16];
  byte bVar10;
  uint uVar11;
  uint64_t a;
  ulong uVar12;
  size_t sVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  sVar13 = len;
  if (0x20 < len) {
    auVar14._8_8_ = seed;
    auVar14._0_8_ = len;
    auVar19 = aesenc(auVar14,_DAT_001a7d00);
    pauVar1 = (undefined1 (*) [16])((long)data + (len - 0x7f));
    if (data < pauVar1) {
      do {
        auVar15 = *(undefined1 (*) [16])((long)data + 0x60);
        auVar20 = aesenc(*data,auVar19);
        auVar25._0_8_ = *(long *)*(undefined1 (*) [16])((long)data + 0x70) + auVar15._0_8_;
        auVar25._8_8_ = *(long *)(*(undefined1 (*) [16])((long)data + 0x70) + 8) + auVar15._8_8_;
        auVar15 = aesenc(*(undefined1 (*) [16])((long)data + 0x20),auVar15 ^ auVar14);
        auVar16 = aesenc(auVar15,*(undefined1 (*) [16])((long)data + 0x30));
        auVar15 = aesenc(*(undefined1 (*) [16])((long)data + 0x40),
                         *(undefined1 (*) [16])((long)data + 0x50));
        auVar24._0_8_ = *(long *)*(undefined1 (*) [16])((long)data + 0x70) - auVar20._0_8_;
        auVar24._8_8_ = *(long *)(*(undefined1 (*) [16])((long)data + 0x70) + 8) - auVar20._8_8_;
        auVar24 = aesdec(auVar24,*(undefined1 (*) [16])((long)data + 0x10));
        auVar20._0_8_ = auVar14._0_8_ + auVar19._0_8_;
        auVar20._8_8_ = auVar14._8_8_ + auVar19._8_8_;
        auVar14 = aesenc(auVar15 ^ auVar25,auVar20);
        auVar19 = aesenc(auVar16,auVar24 ^ *(undefined1 (*) [16])((long)data + 0x50));
        data = (void *)((long)data + 0x80);
      } while (data < pauVar1);
    }
    if ((len & 0x40) != 0) {
      pauVar1 = (undefined1 (*) [16])((long)data + 0x30);
      pauVar9 = (undefined1 (*) [16])((long)data + 0x30);
      auVar15._0_8_ = *(long *)*(undefined1 (*) [16])data + auVar19._0_8_;
      auVar15._8_8_ = *(long *)(*(undefined1 (*) [16])data + 8) + auVar19._8_8_;
      auVar23._0_8_ = auVar14._0_8_ - *(long *)*(undefined1 (*) [16])((long)data + 0x10);
      auVar23._8_8_ = auVar14._8_8_ - *(long *)(*(undefined1 (*) [16])((long)data + 0x10) + 8);
      auVar14 = aesdec(auVar14,auVar15);
      auVar19 = aesdec(auVar19,auVar23);
      auVar21._0_8_ = *(long *)*(undefined1 (*) [16])((long)data + 0x20) + auVar19._0_8_;
      auVar21._8_8_ = *(long *)(*(undefined1 (*) [16])((long)data + 0x20) + 8) + auVar19._8_8_;
      data = (void *)((long)data + 0x40);
      auVar16._0_8_ = auVar14._0_8_ - *(long *)*pauVar1;
      auVar16._8_8_ = auVar14._8_8_ - *(long *)(*pauVar9 + 8);
      auVar14 = aesdec(auVar14,auVar21);
      auVar19 = aesdec(auVar19,auVar16);
    }
    if ((len & 0x20) != 0) {
      pauVar1 = (undefined1 (*) [16])((long)data + 0x10);
      pauVar9 = (undefined1 (*) [16])((long)data + 0x10);
      auVar18._0_8_ = *(long *)*(undefined1 (*) [16])data + auVar19._0_8_;
      auVar18._8_8_ = *(long *)(*(undefined1 (*) [16])data + 8) + auVar19._8_8_;
      data = (void *)((long)data + 0x20);
      auVar22._0_8_ = auVar14._0_8_ - *(long *)*pauVar1;
      auVar22._8_8_ = auVar14._8_8_ - *(long *)(*pauVar9 + 8);
      auVar14 = aesdec(auVar14,auVar18);
      auVar19 = aesdec(auVar19,auVar22);
    }
    if ((len & 0x10) != 0) {
      lVar17 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + auVar14._0_8_;
      auVar19._8_8_ = lVar17 + auVar14._8_8_;
      auVar15 = *data;
      data = (void *)((long)data + 0x10);
      auVar14 = aesdec(auVar14,auVar15);
    }
    auVar15 = aesenc(auVar19,auVar14);
    auVar14 = aesdec(auVar14,auVar15);
    seed = auVar14._0_8_ + auVar19._0_8_;
    len = (size_t)((uint)len & 0xf);
    sVar13 = auVar14._8_8_ + auVar19._8_8_;
  }
  switch(len) {
  default:
    puVar8 = *(undefined1 (*) [16])data;
    data = *(undefined1 (*) [16])data + 8;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(long *)puVar8 + sVar13;
    seed = seed ^ SUB168(auVar7 * ZEXT816(0x9c06faf4d023e3ab),0);
    sVar13 = sVar13 + SUB168(auVar7 * ZEXT816(0x9c06faf4d023e3ab),8);
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
    puVar8 = *(undefined1 (*) [16])data;
    data = *(undefined1 (*) [16])data + 8;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(long *)puVar8 + seed;
    sVar13 = sVar13 ^ SUB168(auVar3 * ZEXT816(0xbd9cacc22c6e9571),0);
    seed = seed + SUB168(auVar3 * ZEXT816(0xbd9cacc22c6e9571),8);
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
    puVar8 = *(undefined1 (*) [16])data;
    data = *(undefined1 (*) [16])data + 8;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(long *)puVar8 + sVar13;
    seed = seed ^ SUB168(auVar4 * ZEXT816(0xd4f06db99d67be4b),0);
    sVar13 = sVar13 + SUB168(auVar4 * ZEXT816(0xd4f06db99d67be4b),8);
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    uVar11 = -(int)len & 7;
    if (((ulong)data & 0xff8) == 0) {
      bVar10 = (char)uVar11 * -8 + 0x40;
      sVar2 = (bVar10 < 0x41) * ('@' - bVar10);
      uVar12 = (ulong)(*(long *)*(undefined1 (*) [16])data << sVar2) >> sVar2;
    }
    else {
      uVar12 = *(ulong *)((long)data - (ulong)uVar11) >> (ulong)(uVar11 * 8);
    }
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar12 + seed;
    sVar13 = sVar13 ^ SUB168(auVar5 * ZEXT816(0x82434fe90edcef39),0);
    seed = seed + SUB168(auVar5 * ZEXT816(0x82434fe90edcef39),8);
  case 0:
    auVar6._8_8_ = 0;
    auVar6._0_8_ = ((seed >> 0x17 | seed << 0x29) + sVar13) * -0x34a50ac51c5553cf ^
                   ((sVar13 >> 0x29 | sVar13 << 0x17) + seed) * -0x136640f27c8d3555;
    return SUB168(auVar6 * ZEXT816(0xc060724a8424f345),8) ^
           SUB168(auVar6 * ZEXT816(0xc060724a8424f345),0);
  }
}

Assistant:

uint64_t T1HA_IA32AES_NAME(const void *data, size_t len, uint64_t seed) {
  uint64_t a = seed;
  uint64_t b = len;

  if (unlikely(len > 32)) {
    __m128i x = _mm_set_epi64x(a, b);
    __m128i y = _mm_aesenc_si128(x, _mm_set_epi64x(prime_5, prime_6));

    const __m128i *__restrict v = (const __m128i *)data;
    const __m128i *__restrict const detent =
        (const __m128i *)((const uint8_t *)data + len - 127);

    while (v < detent) {
      __m128i v0 = _mm_loadu_si128(v + 0);
      __m128i v1 = _mm_loadu_si128(v + 1);
      __m128i v2 = _mm_loadu_si128(v + 2);
      __m128i v3 = _mm_loadu_si128(v + 3);
      __m128i v4 = _mm_loadu_si128(v + 4);
      __m128i v5 = _mm_loadu_si128(v + 5);
      __m128i v6 = _mm_loadu_si128(v + 6);
      __m128i v7 = _mm_loadu_si128(v + 7);

      __m128i v0y = _mm_aesenc_si128(v0, y);
      __m128i v2x6 = _mm_aesenc_si128(v2, _mm_xor_si128(x, v6));
      __m128i v45_67 =
          _mm_xor_si128(_mm_aesenc_si128(v4, v5), _mm_add_epi64(v6, v7));

      __m128i v0y7_1 = _mm_aesdec_si128(_mm_sub_epi64(v7, v0y), v1);
      __m128i v2x6_3 = _mm_aesenc_si128(v2x6, v3);

      x = _mm_aesenc_si128(v45_67, _mm_add_epi64(x, y));
      y = _mm_aesenc_si128(v2x6_3, _mm_xor_si128(v0y7_1, v5));
      v += 8;
    }

    if (len & 64) {
      __m128i v0y = _mm_add_epi64(y, _mm_loadu_si128(v++));
      __m128i v1x = _mm_sub_epi64(x, _mm_loadu_si128(v++));
      x = _mm_aesdec_si128(x, v0y);
      y = _mm_aesdec_si128(y, v1x);

      __m128i v2y = _mm_add_epi64(y, _mm_loadu_si128(v++));
      __m128i v3x = _mm_sub_epi64(x, _mm_loadu_si128(v++));
      x = _mm_aesdec_si128(x, v2y);
      y = _mm_aesdec_si128(y, v3x);
    }

    if (len & 32) {
      __m128i v0y = _mm_add_epi64(y, _mm_loadu_si128(v++));
      __m128i v1x = _mm_sub_epi64(x, _mm_loadu_si128(v++));
      x = _mm_aesdec_si128(x, v0y);
      y = _mm_aesdec_si128(y, v1x);
    }

    if (len & 16) {
      y = _mm_add_epi64(x, y);
      x = _mm_aesdec_si128(x, _mm_loadu_si128(v++));
    }

    x = _mm_add_epi64(_mm_aesdec_si128(x, _mm_aesenc_si128(y, x)), y);
#if defined(__x86_64__) || defined(_M_X64)
#if defined(__SSE4_1__) || defined(__AVX__)
    a = _mm_extract_epi64(x, 0);
    b = _mm_extract_epi64(x, 1);
#else
    a = _mm_cvtsi128_si64(x);
    b = _mm_cvtsi128_si64(_mm_unpackhi_epi64(x, x));
#endif
#else
#if defined(__SSE4_1__) || defined(__AVX__)
    a = (uint32_t)_mm_extract_epi32(x, 0) | (uint64_t)_mm_extract_epi32(x, 1)
                                                << 32;
    b = (uint32_t)_mm_extract_epi32(x, 2) | (uint64_t)_mm_extract_epi32(x, 3)
                                                << 32;
#else
    a = (uint32_t)_mm_cvtsi128_si32(x);
    a |= (uint64_t)_mm_cvtsi128_si32(_mm_shuffle_epi32(x, 1)) << 32;
    x = _mm_unpackhi_epi64(x, x);
    b = (uint32_t)_mm_cvtsi128_si32(x);
    b |= (uint64_t)_mm_cvtsi128_si32(_mm_shuffle_epi32(x, 1)) << 32;
#endif
#endif
#ifdef __AVX__
    _mm256_zeroall();
#elif !(defined(_X86_64_) || defined(__x86_64__) || defined(_M_X64))
    _mm_empty();
#endif
    data = v;
    len &= 15;
  }

  const uint64_t *v = (const uint64_t *)data;
  switch (len) {
  default:
    mixup64(&a, &b, fetch64_le_unaligned(v++), prime_4);
  /* fall through */
  case 24:
  case 23:
  case 22:
  case 21:
  case 20:
  case 19:
  case 18:
  case 17:
    mixup64(&b, &a, fetch64_le_unaligned(v++), prime_3);
  /* fall through */
  case 16:
  case 15:
  case 14:
  case 13:
  case 12:
  case 11:
  case 10:
  case 9:
    mixup64(&a, &b, fetch64_le_unaligned(v++), prime_2);
  /* fall through */
  case 8:
  case 7:
  case 6:
  case 5:
  case 4:
  case 3:
  case 2:
  case 1:
    mixup64(&b, &a, tail64_le_unaligned(v, len), prime_1);
  /* fall through */
  case 0:
    return final64(a, b);
  }
}